

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

char * control_address(connectdata *conn)

{
  connectdata *conn_local;
  
  if ((((((conn->bits).tunnel_proxy & 1U) == 0) && (conn->proxytype != CURLPROXY_SOCKS5)) &&
      (conn->proxytype != CURLPROXY_SOCKS5_HOSTNAME)) &&
     ((conn->proxytype != CURLPROXY_SOCKS4 && (conn->proxytype != CURLPROXY_SOCKS4A)))) {
    conn_local = (connectdata *)conn->ip_addr_str;
  }
  else {
    conn_local = (connectdata *)(conn->host).name;
  }
  return (char *)conn_local;
}

Assistant:

static char *control_address(struct connectdata *conn)
{
  /* Returns the control connection IP address.
     If a proxy tunnel is used, returns the original host name instead, because
     the effective control connection address is the proxy address,
     not the ftp host. */
  if(conn->bits.tunnel_proxy ||
     conn->proxytype == CURLPROXY_SOCKS5 ||
     conn->proxytype == CURLPROXY_SOCKS5_HOSTNAME ||
     conn->proxytype == CURLPROXY_SOCKS4 ||
     conn->proxytype == CURLPROXY_SOCKS4A)
    return conn->host.name;

  return conn->ip_addr_str;
}